

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O0

void __thiscall Assimp::Q3BSPFileParser::getEntities(Q3BSPFileParser *this)

{
  int iVar1;
  int iVar2;
  reference ppsVar3;
  reference __dest;
  reference __src;
  size_t Offset;
  int size;
  Q3BSPFileParser *this_local;
  
  ppsVar3 = std::vector<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>::
            operator[](&this->m_pModel->m_Lumps,0);
  iVar1 = (*ppsVar3)->iSize;
  std::vector<char,_std::allocator<char>_>::resize(&this->m_pModel->m_EntityData,(long)iVar1);
  if (0 < iVar1) {
    ppsVar3 = std::vector<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
              ::operator[](&this->m_pModel->m_Lumps,0);
    iVar2 = (*ppsVar3)->iOffset;
    __dest = std::vector<char,_std::allocator<char>_>::operator[](&this->m_pModel->m_EntityData,0);
    __src = std::vector<char,_std::allocator<char>_>::operator[](&this->m_Data,(long)iVar2);
    memcpy(__dest,__src,(long)iVar1);
  }
  return;
}

Assistant:

void Q3BSPFileParser::getEntities() {
    const int size = m_pModel->m_Lumps[ kEntities ]->iSize;
    m_pModel->m_EntityData.resize( size );
    if ( size > 0 ) {
        size_t Offset = m_pModel->m_Lumps[ kEntities ]->iOffset;
        memcpy( &m_pModel->m_EntityData[ 0 ], &m_Data[ Offset ], sizeof( char ) * size );
    }
}